

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O2

uint64 mkvmuxer::EbmlElementSize(uint64 type,uint8 *value,uint64 size)

{
  uint uVar1;
  uint uVar2;
  
  if (value != (uint8 *)0x0) {
    uVar1 = GetUIntSize(type);
    uVar2 = GetCodedUIntSize(size);
    return (ulong)uVar2 + uVar1 + size;
  }
  return 0;
}

Assistant:

uint64 EbmlElementSize(uint64 type, const uint8* value, uint64 size) {
  if (!value)
    return 0;

  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += size;

  // Size of Datasize
  ebml_size += GetCodedUIntSize(size);

  return ebml_size;
}